

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTransport.h
# Opt level: O3

uint32_t __thiscall
duckdb_apache::thrift::transport::readAll<duckdb::ThriftFileTransport>
          (transport *this,ThriftFileTransport *trans,uint8_t *buf,uint32_t len)

{
  ssize_t sVar1;
  TException *this_00;
  undefined4 in_register_0000000c;
  uint uVar2;
  uint32_t uVar3;
  string local_40;
  
  uVar2 = (uint)buf;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      sVar1 = duckdb::ThriftFileTransport::read
                        ((ThriftFileTransport *)this,uVar3 + (int)trans,
                         (void *)(ulong)(uVar2 - uVar3),CONCAT44(in_register_0000000c,len));
      if ((int)sVar1 == 0) {
        this_00 = (TException *)__cxa_allocate_exception(0x30);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"No more data to read.","");
        TException::TException(this_00,&local_40);
        *(undefined ***)this_00 = &PTR__TException_02477dd8;
        *(undefined4 *)(this_00 + 1) = 3;
        __cxa_throw(this_00,&TTransportException::typeinfo,TException::~TException);
      }
      uVar3 = uVar3 + (int)sVar1;
    } while (uVar3 < uVar2);
  }
  return uVar3;
}

Assistant:

uint32_t readAll(Transport_& trans, uint8_t* buf, uint32_t len) {
  uint32_t have = 0;
  uint32_t get = 0;

  while (have < len) {
    get = trans.read(buf + have, len - have);
    if (get <= 0) {
      throw TTransportException(TTransportException::END_OF_FILE, "No more data to read.");
    }
    have += get;
  }

  return have;
}